

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# eliminate_dead_io_components_pass.h
# Opt level: O2

Analysis __thiscall
spvtools::opt::EliminateDeadIOComponentsPass::GetPreservedAnalyses
          (EliminateDeadIOComponentsPass *this)

{
  return kAnalysisTypes|kAnalysisConstants|kAnalysisNameMap|kAnalysisLoopAnalysis|
         kAnalysisDominatorAnalysis|kAnalysisCFG|kAnalysisCombinators|kAnalysisInstrToBlockMapping|
         kAnalysisBegin;
}

Assistant:

IRContext::Analysis GetPreservedAnalyses() override {
    return IRContext::kAnalysisDefUse |
           IRContext::kAnalysisInstrToBlockMapping |
           IRContext::kAnalysisCombinators | IRContext::kAnalysisCFG |
           IRContext::kAnalysisDominatorAnalysis |
           IRContext::kAnalysisLoopAnalysis | IRContext::kAnalysisNameMap |
           IRContext::kAnalysisConstants | IRContext::kAnalysisTypes;
  }